

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceOfLinearExtrusion::IfcSurfaceOfLinearExtrusion
          (IfcSurfaceOfLinearExtrusion *this)

{
  IfcSurfaceOfLinearExtrusion *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x70,"IfcSurfaceOfLinearExtrusion");
  IfcSweptSurface::IfcSweptSurface
            (&this->super_IfcSweptSurface,&PTR_construction_vtable_24__010b59b0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceOfLinearExtrusion,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceOfLinearExtrusion,_2UL> *)
             &(this->super_IfcSweptSurface).field_0x50,&PTR_construction_vtable_24__010b5a60);
  (this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x10b58d0;
  *(undefined8 *)&this->field_0x70 = 0x10b5998;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x10b58f8;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x10b5920;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.field_0x30 =
       0x10b5948;
  *(undefined8 *)&(this->super_IfcSweptSurface).field_0x50 = 0x10b5970;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcDirection> *)
             &(this->super_IfcSweptSurface).field_0x60,(LazyObject *)0x0);
  return;
}

Assistant:

IfcSurfaceOfLinearExtrusion() : Object("IfcSurfaceOfLinearExtrusion") {}